

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O3

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampNSOperator>::Lookup
          (PrimitiveDictionary<long,_long,_duckdb::ParquetTimestampNSOperator> *this,long *value)

{
  primitive_dictionary_entry_t *ppVar1;
  ulong uVar2;
  primitive_dictionary_entry_t *ppVar3;
  
  uVar2 = duckdb::Hash<long>(*value);
  ppVar1 = this->dictionary;
  uVar2 = uVar2 & this->capacity_mask;
  ppVar3 = ppVar1 + uVar2;
  if (ppVar1[uVar2].index != 0xffffffff) {
    do {
      if (ppVar3->value == *value) {
        return ppVar3;
      }
      uVar2 = uVar2 + 1 & this->capacity_mask;
      ppVar3 = ppVar1 + uVar2;
    } while (ppVar1[uVar2].index != 0xffffffff);
  }
  return ppVar3;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}